

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
pstore::file::system_error::system_error
          (system_error *this,error_code code,string *user_message,string *path)

{
  error_code __ec;
  string local_68;
  ulong local_48;
  error_category *peStack_40;
  string *local_30;
  string *path_local;
  string *user_message_local;
  system_error *this_local;
  error_code code_local;
  
  peStack_40 = code._M_cat;
  this_local._0_4_ = code._M_value;
  *(undefined ***)this = &PTR__system_error_00244650;
  local_48 = CONCAT44(this_local._4_4_,(int)this_local);
  local_30 = path;
  path_local = user_message;
  user_message_local = (string *)this;
  code_local._0_8_ = peStack_40;
  message<std::__cxx11::string>(&local_68,this,user_message,path);
  __ec._0_8_ = local_48 & 0xffffffff;
  __ec._M_cat = peStack_40;
  std::system_error::system_error(&this->super_system_error,__ec,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  *(undefined ***)this = &PTR__system_error_00244650;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  return;
}

Assistant:

system_error::system_error (std::error_code const code, std::string const & user_message,
                                    std::string path)
                : std::system_error (code, message (user_message, path))
                , path_ (std::move (path)) {}